

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_free(roaring_bitmap_t *r)

{
  if (r != (roaring_bitmap_t *)0x0) {
    if (((r->high_low_container).flags & 2) == 0) {
      ra_clear_containers(&r->high_low_container);
      (*global_memory_hook.free)((r->high_low_container).containers);
      (r->high_low_container).keys = (uint16_t *)0x0;
      (r->high_low_container).typecodes = (uint8_t *)0x0;
      (r->high_low_container).size = 0;
      (r->high_low_container).allocation_size = 0;
      (r->high_low_container).containers = (void **)0x0;
    }
    (*global_memory_hook.free)(r);
    return;
  }
  return;
}

Assistant:

void roaring_bitmap_free(const roaring_bitmap_t *r) {
    if (r == NULL) {
        return;
    }
    if (!is_frozen(r)) {
        ra_clear((roaring_array_t *)&r->high_low_container);
    }
    roaring_free((roaring_bitmap_t *)r);
}